

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
  *pFVar3;
  double *pdVar4;
  value_type vVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  vVar5 = FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  dVar6 = cos((this->right_->fadexpr_).expr_.val_);
  pFVar2 = this->right_;
  pdVar4 = &(pFVar2->fadexpr_).expr_.defaultVal;
  if ((pFVar2->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar4 = (pFVar2->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar4;
  dVar7 = sin((pFVar2->fadexpr_).expr_.val_);
  pFVar3 = this->left_;
  dVar8 = ::exp(-((((pFVar3->fadexpr_).left_)->fadexpr_).expr_.fadexpr_.expr_)->val_);
  dVar9 = ::exp((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.val_);
  return dVar6 * vVar5 - (dVar8 - dVar9) * dVar7 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}